

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectStoreToken.cpp
# Opt level: O0

bool ObjectStoreToken::selectBackend(string *backend)

{
  bool bVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    static_createToken_abi_cxx11_ = OSToken::createToken;
    static_accessToken_abi_cxx11_ = OSToken::accessToken;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    softHSMLog(3,"selectBackend",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectStoreToken.cpp"
               ,0x44,"Unknown value (%s) for objectstore.backend in configuration",uVar2);
  }
  return bVar1;
}

Assistant:

bool ObjectStoreToken::selectBackend(const std::string &backend)
{
	if (backend == "file")
	{
		static_createToken = reinterpret_cast<CreateToken>(OSToken::createToken);
		static_accessToken = reinterpret_cast<AccessToken>(OSToken::accessToken);
	}
#ifdef HAVE_OBJECTSTORE_BACKEND_DB
	else if (backend == "db")
	{
		static_createToken = reinterpret_cast<CreateToken>(DBToken::createToken);
		static_accessToken = reinterpret_cast<AccessToken>(DBToken::accessToken);
	}
#endif
	else
	{
		ERROR_MSG("Unknown value (%s) for objectstore.backend in configuration", backend.c_str());
		return false;
	}